

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtinfo.cpp
# Opt level: O3

VtableHashMap * VirtualTableRegistry::CreateVtableHashMap(ArenaAllocator *alloc)

{
  code *pcVar1;
  bool bVar2;
  BaseDictionary<long,_const_char_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this;
  undefined4 *puVar3;
  ulong uVar4;
  LPCSTR *ppCVar5;
  INT_PTR local_40;
  INT_PTR vtable;
  LPCSTR className;
  
  this = (BaseDictionary<long,_const_char_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          *)new<Memory::ArenaAllocator>(0x38,alloc,0x364470);
  this->buckets = (Type)0x0;
  this->entries = (Type)0x0;
  this->alloc = alloc;
  this->size = 0;
  this->bucketCount = 0;
  this->count = 0;
  this->freeCount = 0;
  this->modFunctionIndex = 0x4b;
  if (alloc == (ArenaAllocator *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                       ,0x8e,"(allocator)","allocator");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  this->stats = (Type)0x0;
  JsUtil::
  BaseDictionary<long,_const_char_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::Initialize(this,300);
  if (m_knownVtableCount != 0) {
    ppCVar5 = &m_knownVtables[0].className;
    uVar4 = 0;
    do {
      local_40 = ((TableEntry *)(ppCVar5 + -1))->vtable;
      vtable = (INT_PTR)*ppCVar5;
      JsUtil::
      BaseDictionary<long,char_const*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
      ::
      Insert<(JsUtil::BaseDictionary<long,char_const*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
                ((BaseDictionary<long,char_const*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                  *)this,&local_40,(char **)&vtable);
      uVar4 = uVar4 + 1;
      ppCVar5 = ppCVar5 + 2;
    } while (uVar4 < m_knownVtableCount);
  }
  return this;
}

Assistant:

VtableHashMap *
VirtualTableRegistry::CreateVtableHashMap(ArenaAllocator * alloc)
{
    VtableHashMap * vtableHashMap = Anew(alloc, VtableHashMap, alloc, MAX_KNOWN_VTABLES);

    // All classes that derive from RecyclableObject must include DEFINE_VTABLE_CTOR which invokes VirtualTableRegistry::Add
    // at class initialization time. Here we add them to our hash table for easy lookup. Note that on a release build
    // the vtables are merged and thus not all of our types will be registered. So, we can only use this method
    // in a debug build. If we wanted use in a release build, we'll have to explicitly add the vtables to the hash and
    // then validate that we have got all the vtables by comparing in chk build against VirtualTableRegistry.
    for (UINT i=0; i < VirtualTableRegistry::m_knownVtableCount; i++)
    {
        INT_PTR vtable = VirtualTableRegistry::m_knownVtables[i].vtable;
        LPCSTR className = VirtualTableRegistry::m_knownVtables[i].className;
        vtableHashMap->Add(vtable, className);
    }
    return vtableHashMap;
}